

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::CropLayerParams::CropLayerParams(CropLayerParams *this,CropLayerParams *from)

{
  int new_size;
  void *pvVar1;
  BorderAmounts *from_00;
  BorderAmounts *this_00;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__CropLayerParams_003d4b20;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  (this->offset_).current_size_ = 0;
  (this->offset_).total_size_ = 0;
  (this->offset_).rep_ = (Rep *)0x0;
  new_size = (from->offset_).current_size_;
  if (new_size != 0) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(&this->offset_,new_size);
    memcpy(((this->offset_).rep_)->elements,((from->offset_).rep_)->elements,
           (long)(from->offset_).current_size_ << 3);
    (this->offset_).current_size_ = (from->offset_).current_size_;
  }
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  from_00 = from->cropamounts_;
  if (from_00 == (BorderAmounts *)0x0 ||
      from == (CropLayerParams *)&_CropLayerParams_default_instance_) {
    this_00 = (BorderAmounts *)0x0;
  }
  else {
    this_00 = (BorderAmounts *)operator_new(0x30);
    BorderAmounts::BorderAmounts(this_00,from_00);
  }
  this->cropamounts_ = this_00;
  return;
}

Assistant:

CropLayerParams::CropLayerParams(const CropLayerParams& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      offset_(from.offset_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  if (from.has_cropamounts()) {
    cropamounts_ = new ::CoreML::Specification::BorderAmounts(*from.cropamounts_);
  } else {
    cropamounts_ = NULL;
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.CropLayerParams)
}